

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  __m128i v0_3;
  int i_3;
  __m128i input3_2;
  __m128i input2_2;
  __m128i input1_2;
  __m128i input0_2;
  __m128i v3_2;
  __m128i v2_2;
  __m128i v1_2;
  __m128i v0_2;
  int i_2;
  __m128i input7_1;
  __m128i input6_1;
  __m128i input5_1;
  __m128i input4_1;
  __m128i input3_1;
  __m128i input2_1;
  __m128i input1_1;
  __m128i input0_1;
  __m128i v7_1;
  __m128i v6_1;
  __m128i v5_1;
  __m128i v4_1;
  __m128i v3_1;
  __m128i v2_1;
  __m128i v1_1;
  __m128i v0_1;
  int i_1;
  __m128i input15;
  __m128i input14;
  __m128i input13;
  __m128i input12;
  __m128i input11;
  __m128i input10;
  __m128i input9;
  __m128i input8;
  __m128i input7;
  __m128i input6;
  __m128i input5;
  __m128i input4;
  __m128i input3;
  __m128i input2;
  __m128i input1;
  __m128i input0;
  __m128i v15;
  __m128i v14;
  __m128i v13;
  __m128i v12;
  __m128i v11;
  __m128i v10;
  __m128i v9;
  __m128i v8;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  size_t i;
  uint32_t n_cycles;
  __m128i *data_vectors;
  undefined4 local_1a80;
  undefined4 local_1a7c;
  undefined1 local_1a78 [16];
  undefined1 local_1a68 [16];
  undefined4 local_1a2c;
  undefined1 local_1a28 [16];
  undefined1 local_1a18 [16];
  undefined1 local_1a08 [16];
  undefined1 local_19f8 [16];
  undefined4 local_199c;
  undefined1 local_1998 [16];
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined4 local_188c;
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined8 local_1688;
  int j;
  int i_4;
  __m128i input1_3;
  __m128i input0_3;
  __m128i v1_3;
  
  uVar15 = in_ESI >> 3;
  for (local_1688 = 0; local_1688 + 0x10 <= (ulong)uVar15; local_1688 = local_1688 + 0x10) {
    pauVar16 = (undefined1 (*) [16])(in_RDI + local_1688 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_1688 * 0x10);
    pauVar19 = (undefined1 (*) [16])(in_RDI + 0x20 + local_1688 * 0x10);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + local_1688 * 0x10);
    pauVar18 = (undefined1 (*) [16])(in_RDI + 0x40 + local_1688 * 0x10);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x50 + local_1688 * 0x10);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 0x60 + local_1688 * 0x10);
    pauVar5 = (undefined1 (*) [16])(in_RDI + 0x70 + local_1688 * 0x10);
    pauVar17 = (undefined1 (*) [16])(in_RDI + 0x80 + local_1688 * 0x10);
    pauVar6 = (undefined1 (*) [16])(in_RDI + 0x90 + local_1688 * 0x10);
    pauVar7 = (undefined1 (*) [16])(in_RDI + 0xa0 + local_1688 * 0x10);
    pauVar8 = (undefined1 (*) [16])(in_RDI + 0xb0 + local_1688 * 0x10);
    pauVar9 = (undefined1 (*) [16])(in_RDI + 0xc0 + local_1688 * 0x10);
    pauVar10 = (undefined1 (*) [16])(in_RDI + 0xd0 + local_1688 * 0x10);
    pauVar11 = (undefined1 (*) [16])(in_RDI + 0xe0 + local_1688 * 0x10);
    pauVar12 = (undefined1 (*) [16])(in_RDI + 0xf0 + local_1688 * 0x10);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar16,auVar13);
    auVar14 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_1798 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar16,auVar13);
    auVar14 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_17a8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsllw_avx(*pauVar2,ZEXT416(8));
    local_17b8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsrlw_avx(*pauVar2,ZEXT416(8));
    local_17c8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar18,auVar13);
    auVar14 = vpsllw_avx(*pauVar3,ZEXT416(8));
    local_17d8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar18,auVar13);
    auVar14 = vpsrlw_avx(*pauVar3,ZEXT416(8));
    local_17e8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar4,auVar13);
    auVar14 = vpsllw_avx(*pauVar5,ZEXT416(8));
    local_17f8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar4,auVar13);
    auVar14 = vpsrlw_avx(*pauVar5,ZEXT416(8));
    local_1808 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar17,auVar13);
    auVar14 = vpsllw_avx(*pauVar6,ZEXT416(8));
    local_1818 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar17,auVar13);
    auVar14 = vpsrlw_avx(*pauVar6,ZEXT416(8));
    local_1828 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar7,auVar13);
    auVar14 = vpsllw_avx(*pauVar8,ZEXT416(8));
    local_1838 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar7,auVar13);
    auVar14 = vpsrlw_avx(*pauVar8,ZEXT416(8));
    local_1848 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar9,auVar13);
    auVar14 = vpsllw_avx(*pauVar10,ZEXT416(8));
    local_1858 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar9,auVar13);
    auVar14 = vpsrlw_avx(*pauVar10,ZEXT416(8));
    local_1868 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar11,auVar13);
    auVar14 = vpsllw_avx(*pauVar12,ZEXT416(8));
    local_1878 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar11,auVar13);
    auVar14 = vpsrlw_avx(*pauVar12,ZEXT416(8));
    local_1888 = vpor_avx(auVar13,auVar14);
    for (local_188c = 0; local_188c < 8; local_188c = local_188c + 1) {
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1798 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1798 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1798 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1798 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1798 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1798 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1798 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1798 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1798 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1798 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1798 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1798 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1798 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1798 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1798 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1798[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_17a8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_17a8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_17a8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_17a8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_17a8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_17a8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_17a8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_17a8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_17a8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_17a8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_17a8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_17a8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_17a8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_17a8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_17a8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_17a8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_17b8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_17b8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_17b8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_17b8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_17b8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_17b8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_17b8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_17b8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_17b8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_17b8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_17b8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_17b8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_17b8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_17b8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_17b8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_17b8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_17c8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_17c8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_17c8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_17c8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_17c8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_17c8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_17c8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_17c8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_17c8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_17c8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_17c8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_17c8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_17c8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_17c8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_17c8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_17c8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_17d8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_17d8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_17d8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_17d8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_17d8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_17d8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_17d8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_17d8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_17d8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_17d8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_17d8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_17d8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_17d8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_17d8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_17d8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_17d8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_17e8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_17e8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_17e8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_17e8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_17e8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_17e8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_17e8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_17e8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_17e8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_17e8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_17e8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_17e8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_17e8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_17e8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_17e8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_17e8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_17f8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_17f8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_17f8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_17f8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_17f8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_17f8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_17f8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_17f8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_17f8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_17f8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_17f8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_17f8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_17f8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_17f8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_17f8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_17f8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1808 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1808 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1808 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1808 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1808 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1808 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1808 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1808 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1808 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1808 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1808 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1808 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1808 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1808 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1808 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1808[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1818 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1818 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1818 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1818 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1818 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1818 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1818 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1818 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1818 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1818 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1818 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1818 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1818 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1818 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1818 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1818[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1828 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1828 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1828 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1828 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1828 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1828 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1828 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1828 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1828 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1828 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1828 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1828 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1828 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1828 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1828 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1828[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1838 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1838 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1838 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1838 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1838 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1838 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1838 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1838 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1838 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1838 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1838 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1838 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1838 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1838 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1838 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1838[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1848 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1848 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1848 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1848 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1848 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1848 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1848 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1848 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1848 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1848 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1848 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1848 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1848 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1848 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1848 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1848[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1858 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1858 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1858 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1858 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1858 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1858 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1858 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1858 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1858 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1858 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1858 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1858 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1858 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1858 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1858 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1858[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1868 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1868 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1868 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1868 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1868 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1868 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1868 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1868 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1868 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1868 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1868 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1868 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1868 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1868 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1868 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1868[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      *(int *)(in_RDX + (long)(7 - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1878 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1878 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1878 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1878 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1878 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1878 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1878 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1878 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1878 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1878 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1878 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1878 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1878 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1878 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1878 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1878[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_188c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_188c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1888 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1888 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1888 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1888 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1888 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1888 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1888 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1888 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1888 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1888 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1888 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1888 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1888 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1888 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1888 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1888[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_188c) * 4);
      local_1798 = vpaddb_avx(local_1798,local_1798);
      local_17a8 = vpaddb_avx(local_17a8,local_17a8);
      local_17b8 = vpaddb_avx(local_17b8,local_17b8);
      local_17c8 = vpaddb_avx(local_17c8,local_17c8);
      local_17d8 = vpaddb_avx(local_17d8,local_17d8);
      local_17e8 = vpaddb_avx(local_17e8,local_17e8);
      local_17f8 = vpaddb_avx(local_17f8,local_17f8);
      local_1808 = vpaddb_avx(local_1808,local_1808);
      local_1818 = vpaddb_avx(local_1818,local_1818);
      local_1828 = vpaddb_avx(local_1828,local_1828);
      local_1838 = vpaddb_avx(local_1838,local_1838);
      local_1848 = vpaddb_avx(local_1848,local_1848);
      local_1858 = vpaddb_avx(local_1858,local_1858);
      local_1868 = vpaddb_avx(local_1868,local_1868);
      local_1878 = vpaddb_avx(local_1878,local_1878);
      local_1888 = vpaddb_avx(local_1888,local_1888);
    }
  }
  for (; local_1688 + 8 <= (ulong)uVar15; local_1688 = local_1688 + 8) {
    pauVar17 = (undefined1 (*) [16])(in_RDI + local_1688 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_1688 * 0x10);
    pauVar19 = (undefined1 (*) [16])(in_RDI + 0x20 + local_1688 * 0x10);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + local_1688 * 0x10);
    pauVar18 = (undefined1 (*) [16])(in_RDI + 0x40 + local_1688 * 0x10);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x50 + local_1688 * 0x10);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 0x60 + local_1688 * 0x10);
    pauVar5 = (undefined1 (*) [16])(in_RDI + 0x70 + local_1688 * 0x10);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar17,auVar13);
    auVar14 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_1928 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar17,auVar13);
    auVar14 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_1938 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsllw_avx(*pauVar2,ZEXT416(8));
    local_1948 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsrlw_avx(*pauVar2,ZEXT416(8));
    local_1958 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar18,auVar13);
    auVar14 = vpsllw_avx(*pauVar3,ZEXT416(8));
    local_1968 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar18,auVar13);
    auVar14 = vpsrlw_avx(*pauVar3,ZEXT416(8));
    local_1978 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar4,auVar13);
    auVar14 = vpsllw_avx(*pauVar5,ZEXT416(8));
    local_1988 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar4,auVar13);
    auVar14 = vpsrlw_avx(*pauVar5,ZEXT416(8));
    local_1998 = vpor_avx(auVar13,auVar14);
    for (local_199c = 0; local_199c < 8; local_199c = local_199c + 1) {
      *(int *)(in_RDX + (long)(7 - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1928 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1928 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1928 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1928 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1928 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1928 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1928 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1928 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1928 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1928 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1928 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1928 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1928 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1928 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1928 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1928[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_199c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1938 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1938 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1938 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1938 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1938 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1938 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1938 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1938 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1938 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1938 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1938 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1938 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1938 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1938 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1938 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1938[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_199c) * 4);
      *(int *)(in_RDX + (long)(7 - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1948 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1948 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1948 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1948 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1948 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1948 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1948 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1948 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1948 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1948 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1948 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1948 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1948 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1948 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1948 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1948[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_199c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1958 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1958 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1958 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1958 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1958 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1958 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1958 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1958 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1958 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1958 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1958 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1958 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1958 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1958 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1958 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1958[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_199c) * 4);
      *(int *)(in_RDX + (long)(7 - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1968 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1968 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1968 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1968 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1968 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1968 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1968 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1968 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1968 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1968 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1968 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1968 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1968 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1968 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1968 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1968[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_199c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1978 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1978 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1978 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1978 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1978 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1978 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1978 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1978 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1978 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1978 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1978 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1978 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1978 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1978 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1978 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1978[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_199c) * 4);
      *(int *)(in_RDX + (long)(7 - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1988 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1988 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1988 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1988 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1988 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1988 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1988 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1988 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1988 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1988 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1988 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1988 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1988 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1988 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1988 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1988[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_199c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_199c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1998 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1998 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1998 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1998 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1998 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1998 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1998 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1998 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1998 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1998 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1998 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1998 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1998 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1998 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1998 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1998[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_199c) * 4);
      local_1928 = vpaddb_avx(local_1928,local_1928);
      local_1938 = vpaddb_avx(local_1938,local_1938);
      local_1948 = vpaddb_avx(local_1948,local_1948);
      local_1958 = vpaddb_avx(local_1958,local_1958);
      local_1968 = vpaddb_avx(local_1968,local_1968);
      local_1978 = vpaddb_avx(local_1978,local_1978);
      local_1988 = vpaddb_avx(local_1988,local_1988);
      local_1998 = vpaddb_avx(local_1998,local_1998);
    }
  }
  for (; local_1688 + 4 <= (ulong)uVar15; local_1688 = local_1688 + 4) {
    pauVar18 = (undefined1 (*) [16])(in_RDI + local_1688 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_1688 * 0x10);
    pauVar19 = (undefined1 (*) [16])(in_RDI + 0x20 + local_1688 * 0x10);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + local_1688 * 0x10);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar18,auVar13);
    auVar14 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_19f8 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar18,auVar13);
    auVar14 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_1a08 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsllw_avx(*pauVar2,ZEXT416(8));
    local_1a18 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsrlw_avx(*pauVar2,ZEXT416(8));
    local_1a28 = vpor_avx(auVar13,auVar14);
    for (local_1a2c = 0; local_1a2c < 8; local_1a2c = local_1a2c + 1) {
      *(int *)(in_RDX + (long)(7 - local_1a2c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_19f8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_19f8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_19f8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_19f8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_19f8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_19f8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_19f8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_19f8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_19f8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_19f8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_19f8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_19f8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_19f8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_19f8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_19f8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_19f8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_1a2c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_1a2c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1a08 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1a08 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1a08 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1a08 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1a08 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1a08 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1a08 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1a08 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1a08 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1a08 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1a08 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1a08 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1a08 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1a08 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1a08 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1a08[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_1a2c) * 4);
      *(int *)(in_RDX + (long)(7 - local_1a2c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1a18 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1a18 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1a18 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1a18 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1a18 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1a18 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1a18 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1a18 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1a18 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1a18 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1a18 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1a18 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1a18 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1a18 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1a18 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1a18[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_1a2c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_1a2c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1a28 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1a28 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1a28 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1a28 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1a28 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1a28 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1a28 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1a28 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1a28 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1a28 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1a28 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1a28 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1a28 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1a28 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1a28 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1a28[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_1a2c) * 4);
      local_19f8 = vpaddb_avx(local_19f8,local_19f8);
      local_1a08 = vpaddb_avx(local_1a08,local_1a08);
      local_1a18 = vpaddb_avx(local_1a18,local_1a18);
      local_1a28 = vpaddb_avx(local_1a28,local_1a28);
    }
  }
  for (; local_1688 + 2 <= (ulong)uVar15; local_1688 = local_1688 + 2) {
    pauVar19 = (undefined1 (*) [16])(in_RDI + local_1688 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_1688 * 0x10);
    auVar13 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar13 = vpinsrw_avx(auVar13,0xff,2);
    auVar13 = vpinsrw_avx(auVar13,0xff,3);
    auVar13 = vpinsrw_avx(auVar13,0xff,4);
    auVar13 = vpinsrw_avx(auVar13,0xff,5);
    auVar13 = vpinsrw_avx(auVar13,0xff,6);
    auVar13 = vpinsrw_avx(auVar13,0xff,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_1a68 = vpor_avx(auVar13,auVar14);
    auVar13 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar13 = vpinsrw_avx(auVar13,0xff00,2);
    auVar13 = vpinsrw_avx(auVar13,0xff00,3);
    auVar13 = vpinsrw_avx(auVar13,0xff00,4);
    auVar13 = vpinsrw_avx(auVar13,0xff00,5);
    auVar13 = vpinsrw_avx(auVar13,0xff00,6);
    auVar13 = vpinsrw_avx(auVar13,0xff00,7);
    auVar13 = vpand_avx(*pauVar19,auVar13);
    auVar14 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_1a78 = vpor_avx(auVar13,auVar14);
    for (local_1a7c = 0; local_1a7c < 8; local_1a7c = local_1a7c + 1) {
      *(int *)(in_RDX + (long)(7 - local_1a7c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1a68 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1a68 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1a68 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1a68 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1a68 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1a68 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1a68 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1a68 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1a68 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1a68 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1a68 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1a68 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1a68 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1a68 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1a68 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1a68[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_1a7c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_1a7c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_1a78 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_1a78 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_1a78 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_1a78 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_1a78 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_1a78 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_1a78 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_1a78 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_1a78 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_1a78 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_1a78 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_1a78 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_1a78 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_1a78 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_1a78 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_1a78[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_1a7c) * 4);
      local_1a68 = vpaddb_avx(local_1a68,local_1a68);
      local_1a78 = vpaddb_avx(local_1a78,local_1a78);
    }
  }
  for (local_1688 = local_1688 << 3; local_1688 < in_ESI; local_1688 = local_1688 + 1) {
    for (local_1a80 = 0; local_1a80 < 0x10; local_1a80 = local_1a80 + 1) {
      *(int *)(in_RDX + (long)local_1a80 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_1688 * 2) & 1 << ((byte)local_1a80 & 0x1f)) >>
           ((byte)local_1a80 & 0x1f)) + *(int *)(in_RDX + (long)local_1a80 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
        U(8,9) U(10,11) U(12,13) U(14,15)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2,  3) A( 4, 5) A( 6,  7)
            A(8,9) A(10, 11) A(12,13) A(14, 15)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2,  3) P( 4, 5) P( 6,  7)
            P(8,9) P(10, 11) P(12,13) P(14, 15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3) A(4,5) A(6, 7)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}